

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

int ravi_loadlib(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *sym;
  void *plib;
  lua_CFunction p_Var3;
  undefined4 extraout_var;
  LClosure *cl;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  sym = luaL_checklstring(L,2,(size_t *)0x0);
  plib = checkclib(L,pcVar2);
  if (plib == (void *)0x0) {
    plib = lsys_load(L,pcVar2,(uint)(*sym == '*'));
    if (plib == (void *)0x0) {
      pcVar2 = "open";
      goto LAB_0014346b;
    }
    addtoclib(L,pcVar2,plib);
  }
  if (*sym == '*') {
    lua_pushboolean(L,1);
    return 1;
  }
  p_Var3 = lsys_sym(L,plib,sym);
  if (p_Var3 != (lua_CFunction)0x0) {
    iVar1 = (*p_Var3)(L);
    cl = (LClosure *)CONCAT44(extraout_var,iVar1);
    if (cl->p->sizeupvalues == (uint)cl->nupvalues) {
      luaF_initupvals(L,cl);
      ravi_closure_setenv(L);
      return 1;
    }
    __assert_fail("cl->nupvalues == cl->p->sizeupvalues",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/loadlib.c"
                  ,0x1b7,"int ravi_lookforfunc(lua_State *, const char *, const char *)");
  }
  pcVar2 = "init";
LAB_0014346b:
  lua_pushnil(L);
  lua_rotate(L,-2,1);
  lua_pushstring(L,pcVar2);
  return 3;
}

Assistant:

static int ravi_loadlib (lua_State *L) {
  const char *path = luaL_checkstring(L, 1); /* Path to dynamic library */
  const char *init = luaL_checkstring(L, 2); /* Function to call */
  int stat = ravi_lookforfunc(L, path, init);
  if (stat == 0)  /* no errors? */
    return 1;  /* return the loaded function */
  else {  /* error; error message is on stack top */
    lua_pushnil(L);
    lua_insert(L, -2);
    lua_pushstring(L, (stat == ERRLIB) ?  LIB_FAIL : "init");
    return 3;  /* return nil, error message, and where */
  }
}